

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::ConsoleReporter::printHeaderString(ConsoleReporter *this,string *_string,size_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *os;
  pointer pcVar2;
  ulong uVar3;
  long lVar4;
  char local_61;
  Column local_60;
  
  uVar3 = std::__cxx11::string::find((char *)_string,0x2a1267,0);
  lVar4 = uVar3 + 2;
  if (0x13 < uVar3) {
    lVar4 = 0;
  }
  os = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  paVar1 = &local_60.m_string.field_2;
  pcVar2 = (_string->_M_dataplus)._M_p;
  local_60.m_string._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + _string->_M_string_length);
  local_60.m_width = 0x4f;
  local_60.m_indent = lVar4 + indent;
  local_60.m_initialIndent = indent;
  TextFlow::operator<<(os,&local_60);
  local_61 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_61,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.m_string._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.m_string._M_dataplus._M_p,
                    local_60.m_string.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ConsoleReporter::printHeaderString(std::string const& _string, std::size_t indent) {
    // We want to get a bit fancy with line breaking here, so that subsequent
    // lines start after ":" if one is present, e.g.
    // ```
    // blablabla: Fancy
    //            linebreaking
    // ```
    // but we also want to avoid problems with overly long indentation causing
    // the text to take up too many lines, e.g.
    // ```
    // blablabla: F
    //            a
    //            n
    //            c
    //            y
    //            .
    //            .
    //            .
    // ```
    // So we limit the prefix indentation check to first quarter of the possible
    // width
    std::size_t idx = _string.find( ": " );
    if ( idx != std::string::npos && idx < CATCH_CONFIG_CONSOLE_WIDTH / 4 ) {
        idx += 2;
    } else {
        idx = 0;
    }
    m_stream << TextFlow::Column( _string )
                  .indent( indent + idx )
                  .initialIndent( indent )
           << '\n';
}